

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qgraphicsproxywidget.cpp
# Opt level: O3

void QGraphicsProxyWidget::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  QGraphicsProxyWidget *this;
  
  if (_c == InvokeMetaMethod) {
    if (_id == 1) {
      QGraphicsProxyWidgetPrivate::_q_removeWidgetSlot(*(QGraphicsProxyWidgetPrivate **)(_o + 0x18))
      ;
      return;
    }
    if (_id == 0) {
      this = (QGraphicsProxyWidget *)operator_new(0x30);
      QGraphicsProxyWidget(this,(QGraphicsItem *)(_o + 0x10),(WindowFlags)0x0);
      if ((undefined8 *)*_a != (undefined8 *)0x0) {
        *(QGraphicsProxyWidget **)*_a = this;
      }
    }
  }
  return;
}

Assistant:

void QGraphicsProxyWidget::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QGraphicsProxyWidget *>(_o);
    if (_c == QMetaObject::InvokeMetaMethod) {
        switch (_id) {
        case 0: { QGraphicsProxyWidget* _r = _t->newProxyWidget((*reinterpret_cast< std::add_pointer_t<const QWidget*>>(_a[1])));
            if (_a[0]) *reinterpret_cast< QGraphicsProxyWidget**>(_a[0]) = std::move(_r); }  break;
        case 1: _t->d_func()->_q_removeWidgetSlot(); break;
        default: ;
        }
    }
}